

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ReporterBase::ReporterBase(ReporterBase *this,ReporterConfig *config)

{
  ColourMode implSelection;
  int iVar1;
  IConfig *config_00;
  IStream *pIVar2;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  ReporterConfig *config_local;
  ReporterBase *this_local;
  
  config_00 = ReporterConfig::fullConfig(config);
  IEventListener::IEventListener(&this->super_IEventListener,config_00);
  (this->super_IEventListener)._vptr_IEventListener = (_func_int **)&PTR__ReporterBase_00500f20;
  ReporterConfig::takeStream((ReporterConfig *)&this->m_wrapped_stream);
  pIVar2 = Detail::unique_ptr<Catch::IStream>::operator->(&this->m_wrapped_stream);
  iVar1 = (*pIVar2->_vptr_IStream[2])();
  this->m_stream = (ostream *)CONCAT44(extraout_var,iVar1);
  implSelection = ReporterConfig::colourMode(config);
  pIVar2 = Detail::unique_ptr<Catch::IStream>::get(&this->m_wrapped_stream);
  makeColourImpl((Catch *)&this->m_colour,implSelection,pIVar2);
  pmVar3 = ReporterConfig::customOptions_abi_cxx11_(config);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_customOptions,pmVar3);
  return;
}

Assistant:

ReporterBase::ReporterBase( ReporterConfig&& config ):
        IEventListener( config.fullConfig() ),
        m_wrapped_stream( CATCH_MOVE(config).takeStream() ),
        m_stream( m_wrapped_stream->stream() ),
        m_colour( makeColourImpl( config.colourMode(), m_wrapped_stream.get() ) ),
        m_customOptions( config.customOptions() )
    {}